

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

Chain __thiscall S2Loop::Shape::chain(Shape *this,int i)

{
  int _length;
  ostream *poVar1;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  Shape *pSStack_18;
  int i_local;
  Shape *this_local;
  
  local_1c = i;
  pSStack_18 = this;
  if (i == 0) {
    _length = num_edges(this);
    S2Shape::Chain::Chain((Chain *)&this_local,0,_length);
    return (Chain)this_local;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
             ,0x5e3,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_30);
  poVar1 = std::operator<<(poVar1,"Check failed: (i) == (0) ");
  S2LogMessageVoidify::operator&(&local_1d,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

S2Shape::Chain S2Loop::Shape::chain(int i) const {
  S2_DCHECK_EQ(i, 0);
  return Chain(0, Shape::num_edges());  // Avoid virtual call.
}